

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O0

void __thiscall util_tests::span_write_bytes::test_method(span_write_bytes *this)

{
  bool bVar1;
  byte *pbVar2;
  reference pvVar3;
  long in_FS_OFFSET;
  Span<std::byte> mut_bytes;
  array<unsigned_char,_2UL> mut_arr;
  char *in_stack_fffffffffffffe88;
  lazy_ostream *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  size_type in_stack_fffffffffffffea0;
  array<unsigned_char,_2UL> *in_stack_fffffffffffffea8;
  const_string *in_stack_fffffffffffffeb0;
  size_t in_stack_fffffffffffffeb8;
  size_t line_num;
  const_string *in_stack_fffffffffffffec0;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffffec8;
  unit_test_log_t *this_00;
  lazy_ostream local_cc;
  undefined1 local_b8 [32];
  unit_test_log_t local_98 [2];
  const_string local_88;
  lazy_ostream local_74;
  undefined1 local_60 [64];
  Span<std::byte> local_20;
  undefined2 local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_a = 0xbbaa;
  local_20 = MakeWritableByteSpan<std::array<unsigned_char,2ul>&>
                       ((array<unsigned_char,_2UL> *)in_stack_fffffffffffffe98);
  pbVar2 = Span<std::byte>::operator[]
                     ((Span<std::byte> *)in_stack_fffffffffffffe98,(size_t)in_stack_fffffffffffffe90
                     );
  *pbVar2 = 0x11;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe98,
               (pointer)in_stack_fffffffffffffe90,(unsigned_long)in_stack_fffffffffffffe88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe88);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
               in_stack_fffffffffffffeb0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffe90,(char (*) [1])in_stack_fffffffffffffe88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe98,
               (pointer)in_stack_fffffffffffffe90,(unsigned_long)in_stack_fffffffffffffe88);
    pvVar3 = std::array<unsigned_char,_2UL>::at(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0)
    ;
    local_74._vptr_lazy_ostream._0_4_ = 0xaa;
    in_stack_fffffffffffffe98 = "0xaa";
    in_stack_fffffffffffffe90 = &local_74;
    in_stack_fffffffffffffe88 = "mut_arr.at(0)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
              (local_60,(undefined1 *)((long)&local_74._vptr_lazy_ostream + 4),0x114,1,2,pvVar3);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffe88);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    file = &local_88;
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe98,
               (pointer)in_stack_fffffffffffffe90,(unsigned_long)in_stack_fffffffffffffe88);
    this_00 = local_98;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe88);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,file,line_num,in_stack_fffffffffffffeb0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffe90,(char (*) [1])in_stack_fffffffffffffe88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe98,
               (pointer)in_stack_fffffffffffffe90,(unsigned_long)in_stack_fffffffffffffe88);
    in_stack_fffffffffffffeb0 =
         (const_string *)
         std::array<unsigned_char,_2UL>::at(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    local_cc._vptr_lazy_ostream._0_4_ = 0x11;
    in_stack_fffffffffffffe98 = "0x11";
    in_stack_fffffffffffffe90 = &local_cc;
    in_stack_fffffffffffffe88 = "mut_arr.at(1)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
              (local_b8,(undefined1 *)((long)&local_cc._vptr_lazy_ostream + 4),0x115,1,2,
               in_stack_fffffffffffffeb0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffe88);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(span_write_bytes)
{
    std::array mut_arr{uint8_t{0xaa}, uint8_t{0xbb}};
    const auto mut_bytes{MakeWritableByteSpan(mut_arr)};
    mut_bytes[1] = std::byte{0x11};
    BOOST_CHECK_EQUAL(mut_arr.at(0), 0xaa);
    BOOST_CHECK_EQUAL(mut_arr.at(1), 0x11);
}